

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateServiceMethodDocComment
               (Printer *printer,MethodDescriptor *method)

{
  MethodDescriptor *in_RSI;
  undefined8 in_RDI;
  string local_e0 [8];
  string *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  Printer *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  Printer *in_stack_ffffffffffffff50;
  string local_a0 [8];
  MethodDescriptor *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  Descriptor *in_stack_ffffffffffffff78;
  string local_80 [48];
  string local_50;
  string local_30 [32];
  MethodDescriptor *local_10;
  undefined1 uStack_1;
  
  uStack_1 = (undefined1)((ulong)in_RDI >> 0x38);
  local_10 = in_RSI;
  io::Printer::Print<>(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
  GenerateDocCommentBody<google::protobuf::MethodDescriptor>
            ((Printer *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
  MethodDescriptor::name_abi_cxx11_(local_10);
  UnderscoresToCamelCase(&local_50,(bool)uStack_1);
  EscapePhpdoc(in_stack_ffffffffffffff28);
  io::Printer::Print<char[12],std::__cxx11::string>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             &in_stack_ffffffffffffff40->variable_delimiter_,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)&local_50);
  MethodDescriptor::input_type((MethodDescriptor *)0x4aad3b);
  FullClassName<google::protobuf::Descriptor>
            (in_stack_ffffffffffffff78,(bool)in_stack_ffffffffffffff77);
  EscapePhpdoc(in_stack_ffffffffffffff28);
  io::Printer::Print<char[11],std::__cxx11::string>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             &in_stack_ffffffffffffff40->variable_delimiter_,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_a0);
  MethodDescriptor::output_type((MethodDescriptor *)0x4aadb6);
  FullClassName<google::protobuf::Descriptor>
            (in_stack_ffffffffffffff78,(bool)in_stack_ffffffffffffff77);
  EscapePhpdoc(in_stack_ffffffffffffff28);
  io::Printer::Print<char[12],std::__cxx11::string>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             &in_stack_ffffffffffffff40->variable_delimiter_,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  std::__cxx11::string::~string(local_e0);
  return;
}

Assistant:

void GenerateServiceMethodDocComment(io::Printer* printer,
                              const MethodDescriptor* method) {
  printer->Print("/**\n");
  GenerateDocCommentBody(printer, method);
  printer->Print(
    " * Method <code>^method_name^</code>\n"
    " *\n",
    "method_name", EscapePhpdoc(UnderscoresToCamelCase(method->name(), false)));
  printer->Print(
    " * @param \\^input_type^ $request\n",
    "input_type", EscapePhpdoc(FullClassName(method->input_type(), false)));
  printer->Print(
    " * @return \\^return_type^\n"
    " */\n",
    "return_type", EscapePhpdoc(FullClassName(method->output_type(), false)));
}